

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

void __thiscall QTextEditPrivate::createAutoBulletList(QTextEditPrivate *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  QTextCursor cursor;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::textCursor((QWidgetTextControl *)&local_80);
  QTextCursor::beginEditBlock();
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::blockFormat();
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QTextListFormat::QTextListFormat((QTextListFormat *)&local_78);
  ::QVariant::QVariant(&local_50,-1);
  iVar2 = (int)(QTextListFormat *)&local_78;
  QTextFormat::setProperty(iVar2,(QVariant *)0x3000);
  ::QVariant::~QVariant(&local_50);
  iVar3 = (int)(QTextFormat *)&local_68;
  iVar1 = QTextFormat::intProperty(iVar3);
  ::QVariant::QVariant(&local_50,iVar1 + 1);
  QTextFormat::setProperty(iVar2,(QVariant *)0x3001);
  ::QVariant::~QVariant(&local_50);
  ::QVariant::QVariant(&local_50,0);
  QTextFormat::setProperty(iVar3,(QVariant *)0x1040);
  ::QVariant::~QVariant(&local_50);
  QTextCursor::setBlockFormat((QTextBlockFormat *)&local_80);
  QTextCursor::createList((QTextListFormat *)&local_80);
  QTextCursor::endEditBlock();
  QWidgetTextControl::setTextCursor
            ((QWidgetTextControl *)this->control,(QTextCursor *)&local_80,false);
  QTextFormat::~QTextFormat((QTextFormat *)&local_78);
  QTextFormat::~QTextFormat((QTextFormat *)&local_68);
  QTextCursor::~QTextCursor((QTextCursor *)&local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEditPrivate::createAutoBulletList()
{
    QTextCursor cursor = control->textCursor();
    cursor.beginEditBlock();

    QTextBlockFormat blockFmt = cursor.blockFormat();

    QTextListFormat listFmt;
    listFmt.setStyle(QTextListFormat::ListDisc);
    listFmt.setIndent(blockFmt.indent() + 1);

    blockFmt.setIndent(0);
    cursor.setBlockFormat(blockFmt);

    cursor.createList(listFmt);

    cursor.endEditBlock();
    control->setTextCursor(cursor);
}